

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6850.cpp
# Opt level: O0

void __thiscall
Motorola::ACIA::ACIA::ACIA(ACIA *this,HalfCycles transmit_clock_rate,HalfCycles receive_clock_rate)

{
  bool bVar1;
  HalfCycles *local_88;
  ACIA *this_local;
  HalfCycles receive_clock_rate_local;
  HalfCycles transmit_clock_rate_local;
  
  this_local = (ACIA *)receive_clock_rate.super_WrappedInt<HalfCycles>.length_;
  receive_clock_rate_local = transmit_clock_rate;
  ClockingHint::Source::Source(&this->super_Source);
  Serial::Line<false>::ReadDelegate::ReadDelegate(&this->super_ReadDelegate);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_00c97138;
  (this->super_ReadDelegate)._vptr_ReadDelegate = (_func_int **)&DAT_00c97158;
  Serial::Line<false>::Line(&this->receive);
  Serial::Line<false>::Line(&this->clear_to_send);
  Serial::Line<false>::Line(&this->data_carrier_detect);
  Serial::Line<false>::Line(&this->transmit);
  Serial::Line<false>::Line(&this->request_to_send);
  this->divider_ = 1;
  this->parity_ = None;
  this->data_bits_ = 7;
  this->stop_bits_ = 2;
  this->next_transmission_ = 0x100;
  this->received_data_ = 0x100;
  this->bits_received_ = 0;
  this->bits_incoming_ = 0;
  this->overran_ = false;
  this->receive_interrupt_enabled_ = false;
  this->transmit_interrupt_enabled_ = false;
  (this->transmit_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)receive_clock_rate_local.super_WrappedInt<HalfCycles>.length_;
  bVar1 = WrappedInt<HalfCycles>::operator!=((WrappedInt<HalfCycles> *)&this_local,&SameAsTransmit);
  if (bVar1) {
    local_88 = (HalfCycles *)&this_local;
  }
  else {
    local_88 = &receive_clock_rate_local;
  }
  (this->receive_clock_rate_).super_WrappedInt<HalfCycles>.length_ =
       (IntType)(local_88->super_WrappedInt<HalfCycles>).length_;
  this->interrupt_line_ = false;
  this->interrupt_delegate_ = (InterruptDelegate *)0x0;
  Serial::Line<false>::set_writer_clock_rate(&this->transmit,receive_clock_rate_local);
  Serial::Line<false>::set_writer_clock_rate(&this->request_to_send,receive_clock_rate_local);
  return;
}

Assistant:

ACIA::ACIA(HalfCycles transmit_clock_rate, HalfCycles receive_clock_rate) :
	transmit_clock_rate_(transmit_clock_rate),
	receive_clock_rate_((receive_clock_rate != SameAsTransmit) ? receive_clock_rate : transmit_clock_rate) {
	transmit.set_writer_clock_rate(transmit_clock_rate);
	request_to_send.set_writer_clock_rate(transmit_clock_rate);
}